

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void mocksAreCountedAsChecksTestFunction_(void)

{
  MockSupport *pMVar1;
  SimpleString SStack_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"foo");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"bar");
  (*pMVar1->_vptr_MockSupport[5])(pMVar1,3,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"lazy");
  (*pMVar1->_vptr_MockSupport[4])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

static void mocksAreCountedAsChecksTestFunction_()
{
    mock().expectOneCall("foo");
    mock().expectNCalls(3, "bar");
    mock().expectNoCall("lazy");
    mock().clear();
}